

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_MuxStructDump(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Str_t *vStr)

{
  uint uVar1;
  int iVar2;
  size_t __size;
  char *pcVar3;
  
  if (((uint)*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
    vStr->nSize = 0;
    Str_MuxStructDump_rec(p,pObj,vStr);
    uVar1 = vStr->nSize;
    if (uVar1 == vStr->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = 0x10;
      }
      else {
        __size = (ulong)uVar1 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(__size);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,__size);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = (int)__size;
      }
    }
    else {
      pcVar3 = vStr->pArray;
    }
    iVar2 = vStr->nSize;
    vStr->nSize = iVar2 + 1;
    pcVar3[iVar2] = '\0';
    pObj->field_0x3 = pObj->field_0x3 & 0xbf;
    return;
  }
  __assert_fail("!pObj->fMark0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,0x15c,"void Str_MuxStructDump(Gia_Man_t *, Gia_Obj_t *, Vec_Str_t *)");
}

Assistant:

void Str_MuxStructDump( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Str_t * vStr )
{
    assert( !pObj->fMark0 );
    pObj->fMark0 = 1;
    Vec_StrClear( vStr );
    Str_MuxStructDump_rec( p, pObj, vStr );
    Vec_StrPush( vStr, '\0' );
    pObj->fMark0 = 0;
}